

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits)

{
  Result RVar1;
  Enum EVar2;
  Location loc;
  undefined1 local_68 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_58;
  bool local_48;
  bool bStack_47;
  bool bStack_46;
  undefined4 uStack_45;
  undefined1 uStack_41;
  MemoryDesc local_38;
  
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_68._0_8_ = (this->filename_)._M_len;
  local_68._8_8_ = (this->filename_)._M_str;
  local_58.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnMemory(&this->validator_,(Location *)local_68,limits);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_58.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)limits->initial;
    local_58._8_8_ = limits->max;
    local_48 = limits->has_max;
    bStack_47 = limits->is_shared;
    bStack_46 = limits->is_64;
    uStack_41 = limits->field_0x17;
    uStack_45 = *(undefined4 *)&limits->field_0x13;
    local_38.type.limits.has_max = limits->has_max;
    local_38.type.limits.is_shared = limits->is_shared;
    local_38.type.limits.is_64 = limits->is_64;
    local_38.type.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
    local_68._8_4_ = 2;
    local_68._0_8_ = &PTR__ExternType_001cf2d0;
    if (((local_48 & 1U) == 0) && (local_58._8_8_ = 0x10000, (bStack_46 & 1U) != 0)) {
      local_58._8_8_ = 0x1000000000000;
    }
    local_38.type.super_ExternType.kind = Memory;
    local_38.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001cf2d0;
    local_38.type.limits.max = local_58._8_8_;
    local_38.type.limits.initial = (uint64_t)local_58.field_1.offset;
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
    emplace_back<wabt::interp::MemoryDesc>(&this->module_->memories,&local_38);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_68);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index, const Limits* limits) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits));
  MemoryType memory_type{*limits};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}